

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVProcessChain.cxx
# Opt level: O2

int testUVProcessChain(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  
  if (argc < 2) {
    pcVar2 = "Invalid arguments.\n";
  }
  else {
    bVar1 = testUVProcessChainBuiltin(argv[1]);
    if (bVar1) {
      bVar1 = testUVProcessChainExternal(argv[1]);
      if (bVar1) {
        bVar1 = testUVProcessChainNone(argv[1]);
        if (bVar1) {
          return 0;
        }
        pcVar2 = "While executing testUVProcessChainNone().\n";
      }
      else {
        pcVar2 = "While executing testUVProcessChainExternal().\n";
      }
    }
    else {
      pcVar2 = "While executing testUVProcessChainBuiltin().\n";
    }
  }
  std::operator<<((ostream *)&std::cout,pcVar2);
  return -1;
}

Assistant:

int testUVProcessChain(int argc, char** const argv)
{
  if (argc < 2) {
    std::cout << "Invalid arguments.\n";
    return -1;
  }

  if (!testUVProcessChainBuiltin(argv[1])) {
    std::cout << "While executing testUVProcessChainBuiltin().\n";
    return -1;
  }

  if (!testUVProcessChainExternal(argv[1])) {
    std::cout << "While executing testUVProcessChainExternal().\n";
    return -1;
  }

  if (!testUVProcessChainNone(argv[1])) {
    std::cout << "While executing testUVProcessChainNone().\n";
    return -1;
  }

  return 0;
}